

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

double __thiscall ON_Font::AppleFontWeightTraitEx(ON_Font *this)

{
  Origin OVar1;
  double local_20;
  ON_Font *this_local;
  
  OVar1 = FontOrigin(this);
  if (((OVar1 != AppleFont) || (this->m_apple_font_weight_trait < -1.0)) ||
     (1.0 < this->m_apple_font_weight_trait)) {
    local_20 = -1.23432101234321e+308;
  }
  else {
    local_20 = this->m_apple_font_weight_trait;
  }
  return local_20;
}

Assistant:

double ON_Font::AppleFontWeightTraitEx() const
{
  return
    ON_Font::Origin::AppleFont == FontOrigin()
    && m_apple_font_weight_trait >= -1.0
    && m_apple_font_weight_trait <= 1.0
    ? m_apple_font_weight_trait
    : ON_UNSET_VALUE;
}